

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# floatingpoint_tests.cpp
# Opt level: O0

void __thiscall
floatingpoint_test::iu_FloatingpointTest_x_iutest_x_IsNAN_Test<float>::Body
          (iu_FloatingpointTest_x_iutest_x_IsNAN_Test<float> *this)

{
  bool bVar1;
  char *pcVar2;
  char *in_R9;
  AssertionHelper local_410;
  Fixed local_3e0;
  undefined1 local_258 [8];
  AssertionResult iutest_ar_1;
  TypeParam nan;
  TypeParam b;
  TypeParam a;
  AssertionHelper local_200;
  Fixed local_1c0;
  undefined1 local_38 [8];
  AssertionResult iutest_ar;
  iu_FloatingpointTest_x_iutest_x_IsNAN_Test<float> *this_local;
  
  iutest_ar._32_8_ = this;
  iutest::detail::AlwaysZero();
  iutest::AssertionResult::Is<bool>
            ((AssertionResult *)local_38,&std::numeric_limits<float>::is_iec559);
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_38);
  if (!bVar1) {
    memset(&local_1c0,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_1c0);
    iutest::internal::GetBooleanAssertionFailureMessage_abi_cxx11_
              ((string *)&a,(internal *)local_38,
               (AssertionResult *)"::std::numeric_limits<TypeParam>::is_iec559","false","true",in_R9
              );
    pcVar2 = (char *)std::__cxx11::string::c_str();
    iutest::AssertionHelper::AssertionHelper
              (&local_200,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/floatingpoint_tests.cpp"
               ,0x58,pcVar2,kAssumeFailure);
    iutest::AssertionHelper::operator=(&local_200,&local_1c0);
    iutest::AssertionHelper::~AssertionHelper(&local_200);
    std::__cxx11::string::~string((string *)&a);
    iutest::AssertionHelper::Fixed::~Fixed(&local_1c0);
  }
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_38);
  if (bVar1) {
    iutest_ar_1._36_4_ = FloatingpointTest<float>::ZERO;
    iutest_ar_1._32_4_ =
         (FloatingpointTest<float>::ONE / FloatingpointTest<float>::ZERO) *
         FloatingpointTest<float>::ZERO;
    iutest::detail::AlwaysZero();
    iuutil::CmpHelperIsNan<float>((AssertionResult *)local_258,"nan",(float *)&iutest_ar_1.m_result)
    ;
    bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_258);
    if (!bVar1) {
      memset(&local_3e0,0,0x188);
      iutest::AssertionHelper::Fixed::Fixed(&local_3e0);
      pcVar2 = iutest::AssertionResult::message((AssertionResult *)local_258);
      iutest::AssertionHelper::AssertionHelper
                (&local_410,
                 "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/floatingpoint_tests.cpp"
                 ,0x5d,pcVar2,kNonFatalFailure);
      iutest::AssertionHelper::operator=(&local_410,&local_3e0);
      iutest::AssertionHelper::~AssertionHelper(&local_410);
      iutest::AssertionHelper::Fixed::~Fixed(&local_3e0);
    }
    iutest::AssertionResult::~AssertionResult((AssertionResult *)local_258);
  }
  return;
}

Assistant:

IUTEST_TYPED_TEST(FloatingpointTest, IsNAN)
{
    IUTEST_ASSUME_TRUE(::std::numeric_limits<TypeParam>::is_iec559);

    TypeParam a=TestFixture::ONE;
    TypeParam b=TestFixture::ZERO;
    const TypeParam nan=(a/b)*b;
    IUTEST_EXPECT_NAN(nan);
}